

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

QList<int> * __thiscall QPlatformPrintDevice::supportedResolutions(QPlatformPrintDevice *this)

{
  long *in_RSI;
  QList<int> *in_RDI;
  QList<int> *this_00;
  
  this_00 = in_RDI;
  if ((*(byte *)((long)in_RSI + 0x9c) & 1) == 0) {
    (**(code **)(*in_RSI + 0x138))();
  }
  QList<int>::QList(this_00,in_RDI);
  return this_00;
}

Assistant:

QList<int> QPlatformPrintDevice::supportedResolutions() const
{
    if (!m_haveResolutions)
        loadResolutions();
    return m_resolutions;
}